

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess-posix.cc
# Opt level: O0

bool __thiscall Subprocess::Start(Subprocess *this,SubprocessSet *set,string *command)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  char *local_1f8;
  char *spawned_args [4];
  undefined1 local_1d0 [6];
  short flags;
  posix_spawnattr_t attr;
  undefined1 local_78 [4];
  int err;
  posix_spawn_file_actions_t action;
  int output_pipe [2];
  string *command_local;
  SubprocessSet *set_local;
  Subprocess *this_local;
  
  iVar1 = pipe(action.__pad + 0xe);
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    Fatal("pipe: %s",pcVar3);
  }
  this->fd_ = action.__pad[0xe];
  if (0x3ff < this->fd_) {
    pcVar3 = strerror(0x18);
    Fatal("pipe: %s",pcVar3);
  }
  SetCloseOnExec(this->fd_);
  attr.__pad[0xf] = posix_spawn_file_actions_init((posix_spawn_file_actions_t *)local_78);
  if (attr.__pad[0xf] != 0) {
    pcVar3 = strerror(attr.__pad[0xf]);
    Fatal("posix_spawn_file_actions_init: %s",pcVar3);
  }
  attr.__pad[0xf] =
       posix_spawn_file_actions_addclose((posix_spawn_file_actions_t *)local_78,action.__pad[0xe]);
  if (attr.__pad[0xf] != 0) {
    pcVar3 = strerror(attr.__pad[0xf]);
    Fatal("posix_spawn_file_actions_addclose: %s",pcVar3);
  }
  attr.__pad[0xf] = posix_spawnattr_init((posix_spawnattr_t *)local_1d0);
  if (attr.__pad[0xf] != 0) {
    pcVar3 = strerror(attr.__pad[0xf]);
    Fatal("posix_spawnattr_init: %s",pcVar3);
  }
  spawned_args[3]._6_2_ = 8;
  attr.__pad[0xf] =
       posix_spawnattr_setsigmask((posix_spawnattr_t *)local_1d0,(sigset_t *)&set->old_mask_);
  if (attr.__pad[0xf] != 0) {
    pcVar3 = strerror(attr.__pad[0xf]);
    Fatal("posix_spawnattr_setsigmask: %s",pcVar3);
  }
  if ((this->use_console_ & 1U) == 0) {
    spawned_args[3]._6_2_ = spawned_args[3]._6_2_ | 2;
    attr.__pad[0xf] =
         posix_spawn_file_actions_addopen((posix_spawn_file_actions_t *)local_78,0,"/dev/null",0,0);
    if (attr.__pad[0xf] != 0) {
      pcVar3 = strerror(attr.__pad[0xf]);
      Fatal("posix_spawn_file_actions_addopen: %s",pcVar3);
    }
    attr.__pad[0xf] =
         posix_spawn_file_actions_adddup2
                   ((posix_spawn_file_actions_t *)local_78,action.__pad[0xf],1);
    if (attr.__pad[0xf] != 0) {
      pcVar3 = strerror(attr.__pad[0xf]);
      Fatal("posix_spawn_file_actions_adddup2: %s",pcVar3);
    }
    attr.__pad[0xf] =
         posix_spawn_file_actions_adddup2
                   ((posix_spawn_file_actions_t *)local_78,action.__pad[0xf],2);
    if (attr.__pad[0xf] != 0) {
      pcVar3 = strerror(attr.__pad[0xf]);
      Fatal("posix_spawn_file_actions_adddup2: %s",pcVar3);
    }
    attr.__pad[0xf] =
         posix_spawn_file_actions_addclose((posix_spawn_file_actions_t *)local_78,action.__pad[0xf])
    ;
    if (attr.__pad[0xf] != 0) {
      pcVar3 = strerror(attr.__pad[0xf]);
      Fatal("posix_spawn_file_actions_addclose: %s",pcVar3);
    }
  }
  attr.__pad[0xf] = 0;
  spawned_args[3]._6_2_ = spawned_args[3]._6_2_ | 0x40;
  attr.__pad[0xf] = posix_spawnattr_setflags((posix_spawnattr_t *)local_1d0,spawned_args[3]._6_2_);
  if (attr.__pad[0xf] != 0) {
    pcVar3 = strerror(attr.__pad[0xf]);
    Fatal("posix_spawnattr_setflags: %s",pcVar3);
  }
  local_1f8 = "/bin/sh";
  spawned_args[0] = "-c";
  spawned_args[1] = (char *)std::__cxx11::string::c_str();
  spawned_args[2] = (char *)0x0;
  attr.__pad[0xf] =
       posix_spawn(&this->pid_,"/bin/sh",(posix_spawn_file_actions_t *)local_78,
                   (posix_spawnattr_t *)local_1d0,&local_1f8,_environ);
  if (attr.__pad[0xf] != 0) {
    pcVar3 = strerror(attr.__pad[0xf]);
    Fatal("posix_spawn: %s",pcVar3);
  }
  attr.__pad[0xf] = posix_spawnattr_destroy((posix_spawnattr_t *)local_1d0);
  if (attr.__pad[0xf] != 0) {
    pcVar3 = strerror(attr.__pad[0xf]);
    Fatal("posix_spawnattr_destroy: %s",pcVar3);
  }
  attr.__pad[0xf] = posix_spawn_file_actions_destroy((posix_spawn_file_actions_t *)local_78);
  if (attr.__pad[0xf] == 0) {
    close(action.__pad[0xf]);
    return true;
  }
  pcVar3 = strerror(attr.__pad[0xf]);
  Fatal("posix_spawn_file_actions_destroy: %s",pcVar3);
}

Assistant:

bool Subprocess::Start(SubprocessSet* set, const string& command) {
  int output_pipe[2];
  if (pipe(output_pipe) < 0)
    Fatal("pipe: %s", strerror(errno));
  fd_ = output_pipe[0];
#if !defined(USE_PPOLL)
  // If available, we use ppoll in DoWork(); otherwise we use pselect
  // and so must avoid overly-large FDs.
  if (fd_ >= static_cast<int>(FD_SETSIZE))
    Fatal("pipe: %s", strerror(EMFILE));
#endif  // !USE_PPOLL
  SetCloseOnExec(fd_);

  posix_spawn_file_actions_t action;
  int err = posix_spawn_file_actions_init(&action);
  if (err != 0)
    Fatal("posix_spawn_file_actions_init: %s", strerror(err));

  err = posix_spawn_file_actions_addclose(&action, output_pipe[0]);
  if (err != 0)
    Fatal("posix_spawn_file_actions_addclose: %s", strerror(err));

  posix_spawnattr_t attr;
  err = posix_spawnattr_init(&attr);
  if (err != 0)
    Fatal("posix_spawnattr_init: %s", strerror(err));

  short flags = 0;

  flags |= POSIX_SPAWN_SETSIGMASK;
  err = posix_spawnattr_setsigmask(&attr, &set->old_mask_);
  if (err != 0)
    Fatal("posix_spawnattr_setsigmask: %s", strerror(err));
  // Signals which are set to be caught in the calling process image are set to
  // default action in the new process image, so no explicit
  // POSIX_SPAWN_SETSIGDEF parameter is needed.

  if (!use_console_) {
    // Put the child in its own process group, so ctrl-c won't reach it.
    flags |= POSIX_SPAWN_SETPGROUP;
    // No need to posix_spawnattr_setpgroup(&attr, 0), it's the default.

    // Open /dev/null over stdin.
    err = posix_spawn_file_actions_addopen(&action, 0, "/dev/null", O_RDONLY,
          0);
    if (err != 0) {
      Fatal("posix_spawn_file_actions_addopen: %s", strerror(err));
    }

    err = posix_spawn_file_actions_adddup2(&action, output_pipe[1], 1);
    if (err != 0)
      Fatal("posix_spawn_file_actions_adddup2: %s", strerror(err));
    err = posix_spawn_file_actions_adddup2(&action, output_pipe[1], 2);
    if (err != 0)
      Fatal("posix_spawn_file_actions_adddup2: %s", strerror(err));
    err = posix_spawn_file_actions_addclose(&action, output_pipe[1]);
    if (err != 0)
      Fatal("posix_spawn_file_actions_addclose: %s", strerror(err));
    // In the console case, output_pipe is still inherited by the child and
    // closed when the subprocess finishes, which then notifies ninja.
  }
#ifdef POSIX_SPAWN_USEVFORK
  flags |= POSIX_SPAWN_USEVFORK;
#endif

  err = posix_spawnattr_setflags(&attr, flags);
  if (err != 0)
    Fatal("posix_spawnattr_setflags: %s", strerror(err));

  const char* spawned_args[] = { "/bin/sh", "-c", command.c_str(), NULL };
  err = posix_spawn(&pid_, "/bin/sh", &action, &attr,
        const_cast<char**>(spawned_args), environ);
  if (err != 0)
    Fatal("posix_spawn: %s", strerror(err));

  err = posix_spawnattr_destroy(&attr);
  if (err != 0)
    Fatal("posix_spawnattr_destroy: %s", strerror(err));
  err = posix_spawn_file_actions_destroy(&action);
  if (err != 0)
    Fatal("posix_spawn_file_actions_destroy: %s", strerror(err));

  close(output_pipe[1]);
  return true;
}